

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

NextCommentStatus __thiscall
google::protobuf::io::Tokenizer::TryConsumeCommentStart(Tokenizer *this)

{
  bool bVar1;
  Tokenizer *this_local;
  
  if ((this->comment_style_ == CPP_COMMENT_STYLE) && (bVar1 = TryConsume(this,'/'), bVar1)) {
    bVar1 = TryConsume(this,'/');
    if (bVar1) {
      this_local._4_4_ = LINE_COMMENT;
    }
    else {
      bVar1 = TryConsume(this,'*');
      if (bVar1) {
        this_local._4_4_ = BLOCK_COMMENT;
      }
      else {
        (this->current_).type = TYPE_SYMBOL;
        std::__cxx11::string::operator=((string *)&(this->current_).text,"/");
        (this->current_).line = this->line_;
        (this->current_).column = this->column_ + -1;
        (this->current_).end_column = this->column_;
        this_local._4_4_ = SLASH_NOT_COMMENT;
      }
    }
  }
  else if ((this->comment_style_ == SH_COMMENT_STYLE) && (bVar1 = TryConsume(this,'#'), bVar1)) {
    this_local._4_4_ = LINE_COMMENT;
  }
  else {
    this_local._4_4_ = NO_COMMENT;
  }
  return this_local._4_4_;
}

Assistant:

Tokenizer::NextCommentStatus Tokenizer::TryConsumeCommentStart() {
  if (comment_style_ == CPP_COMMENT_STYLE && TryConsume('/')) {
    if (TryConsume('/')) {
      return LINE_COMMENT;
    } else if (TryConsume('*')) {
      return BLOCK_COMMENT;
    } else {
      // Oops, it was just a slash.  Return it.
      current_.type = TYPE_SYMBOL;
      current_.text = "/";
      current_.line = line_;
      current_.column = column_ - 1;
      current_.end_column = column_;
      return SLASH_NOT_COMMENT;
    }
  } else if (comment_style_ == SH_COMMENT_STYLE && TryConsume('#')) {
    return LINE_COMMENT;
  } else {
    return NO_COMMENT;
  }
}